

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O0

void __thiscall
rpc_tests::rpc_getblockstats_calculate_percentiles_by_weight::test_method
          (rpc_getblockstats_calculate_percentiles_by_weight *this)

{
  bool bVar1;
  lazy_ostream *scores;
  long in_FS_OFFSET;
  int64_t i_2;
  int64_t i_1;
  int64_t i;
  int64_t total_weight;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> feerates;
  CAmount result4 [5];
  CAmount result3 [5];
  CAmount result2 [5];
  CAmount result [5];
  char *in_stack_fffffffffffff708;
  lazy_ostream *in_stack_fffffffffffff710;
  basic_cstring<const_char> *in_stack_fffffffffffff718;
  int *in_stack_fffffffffffff720;
  undefined7 in_stack_fffffffffffff728;
  undefined1 in_stack_fffffffffffff72f;
  lazy_ostream *in_stack_fffffffffffff730;
  size_t in_stack_fffffffffffff738;
  CAmount *pCVar2;
  const_string *in_stack_fffffffffffff740;
  const_string *file;
  undefined7 in_stack_fffffffffffff748;
  undefined1 in_stack_fffffffffffff74f;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *in_stack_fffffffffffff750;
  CAmount *in_stack_fffffffffffff758;
  long local_738;
  long local_720;
  long local_708;
  lazy_ostream local_6ec;
  undefined1 local_6d8 [68];
  undefined4 local_694;
  undefined4 local_690;
  undefined4 local_68c;
  undefined4 local_688;
  undefined4 local_684;
  undefined4 local_680;
  undefined4 local_67c;
  undefined4 local_678;
  undefined4 local_674;
  undefined4 local_670;
  lazy_ostream local_66c;
  undefined1 local_658 [68];
  lazy_ostream local_614;
  undefined1 local_600 [68];
  lazy_ostream local_5bc;
  undefined1 local_5a8 [68];
  lazy_ostream local_564;
  undefined1 local_550 [68];
  lazy_ostream local_50c;
  undefined1 local_4f8 [68];
  undefined4 local_4b4;
  undefined4 local_4b0;
  undefined4 local_4ac;
  undefined4 local_4a8;
  undefined4 local_4a4;
  undefined4 local_4a0;
  undefined4 local_49c;
  undefined4 local_498;
  undefined4 local_494;
  undefined4 local_490;
  undefined4 local_48c;
  undefined4 local_488;
  lazy_ostream local_484;
  undefined1 local_470 [68];
  lazy_ostream local_42c;
  undefined1 local_418 [68];
  lazy_ostream local_3d4;
  undefined1 local_3c0 [68];
  lazy_ostream local_37c;
  undefined1 local_368 [68];
  lazy_ostream local_324;
  undefined1 local_310 [68];
  undefined4 local_2cc;
  undefined4 local_2c8;
  undefined4 local_2c4;
  undefined4 local_2c0;
  undefined4 local_2bc;
  undefined4 local_2b8;
  undefined4 local_2b4;
  undefined4 local_2b0;
  undefined4 local_2ac;
  undefined4 local_2a8;
  lazy_ostream local_2a4;
  undefined1 local_290 [68];
  lazy_ostream local_24c;
  undefined1 local_238 [68];
  lazy_ostream local_1f4;
  undefined1 local_1e0 [68];
  lazy_ostream local_19c;
  undefined1 local_188 [68];
  lazy_ostream local_144;
  undefined1 local_130 [64];
  undefined4 local_f0;
  undefined4 local_ec;
  undefined4 local_e8;
  undefined4 local_e4;
  const_string local_e0;
  undefined8 local_c8 [6];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78 [2];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48 [2];
  undefined1 local_38 [8];
  undefined1 local_30 [8];
  undefined1 local_28 [8];
  undefined1 local_20 [8];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
             in_stack_fffffffffffff708);
  memset(local_38,0,0x28);
  for (local_708 = 0; local_708 < 100; local_708 = local_708 + 1) {
    local_e4 = 1;
    local_e8 = 1;
    std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
              ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
               CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728),
               in_stack_fffffffffffff720,(int *)in_stack_fffffffffffff718);
  }
  for (local_720 = 0; local_720 < 100; local_720 = local_720 + 1) {
    local_ec = 2;
    local_f0 = 1;
    std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
              ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
               CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728),
               in_stack_fffffffffffff720,(int *)in_stack_fffffffffffff718);
  }
  CalculatePercentilesByWeight
            (in_stack_fffffffffffff758,in_stack_fffffffffffff750,
             CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff718,(pointer)in_stack_fffffffffffff710,
               (unsigned_long)in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff708);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
               in_stack_fffffffffffff740,in_stack_fffffffffffff738,
               (const_string *)in_stack_fffffffffffff730);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff710,(char (*) [1])in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff718,(pointer)in_stack_fffffffffffff710,
               (unsigned_long)in_stack_fffffffffffff708);
    local_144._vptr_lazy_ostream._0_4_ = 1;
    in_stack_fffffffffffff718 = (basic_cstring<const_char> *)0x1ccb7e1;
    in_stack_fffffffffffff710 = &local_144;
    in_stack_fffffffffffff708 = "result[0]";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_130,(undefined1 *)((long)&local_144._vptr_lazy_ostream + 4),0x1ba,1,2,local_38)
    ;
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff708);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff718,(pointer)in_stack_fffffffffffff710,
               (unsigned_long)in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff708);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
               in_stack_fffffffffffff740,in_stack_fffffffffffff738,
               (const_string *)in_stack_fffffffffffff730);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff710,(char (*) [1])in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff718,(pointer)in_stack_fffffffffffff710,
               (unsigned_long)in_stack_fffffffffffff708);
    local_19c._vptr_lazy_ostream._0_4_ = 1;
    in_stack_fffffffffffff718 = (basic_cstring<const_char> *)0x1ccb7e1;
    in_stack_fffffffffffff710 = &local_19c;
    in_stack_fffffffffffff708 = "result[1]";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_188,(undefined1 *)((long)&local_19c._vptr_lazy_ostream + 4),0x1bb,1,2,local_30)
    ;
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff708);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff718,(pointer)in_stack_fffffffffffff710,
               (unsigned_long)in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff708);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
               in_stack_fffffffffffff740,in_stack_fffffffffffff738,
               (const_string *)in_stack_fffffffffffff730);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff710,(char (*) [1])in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff718,(pointer)in_stack_fffffffffffff710,
               (unsigned_long)in_stack_fffffffffffff708);
    local_1f4._vptr_lazy_ostream._0_4_ = 1;
    in_stack_fffffffffffff718 = (basic_cstring<const_char> *)0x1ccb7e1;
    in_stack_fffffffffffff710 = &local_1f4;
    in_stack_fffffffffffff708 = "result[2]";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_1e0,(undefined1 *)((long)&local_1f4._vptr_lazy_ostream + 4),0x1bc,1,2,local_28)
    ;
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff708);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff718,(pointer)in_stack_fffffffffffff710,
               (unsigned_long)in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff708);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
               in_stack_fffffffffffff740,in_stack_fffffffffffff738,
               (const_string *)in_stack_fffffffffffff730);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff710,(char (*) [1])in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff718,(pointer)in_stack_fffffffffffff710,
               (unsigned_long)in_stack_fffffffffffff708);
    local_24c._vptr_lazy_ostream._0_4_ = 2;
    in_stack_fffffffffffff718 = (basic_cstring<const_char> *)0x1bc65e2;
    in_stack_fffffffffffff710 = &local_24c;
    in_stack_fffffffffffff708 = "result[3]";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_238,(undefined1 *)((long)&local_24c._vptr_lazy_ostream + 4),0x1bd,1,2,local_20)
    ;
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff708);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff718,(pointer)in_stack_fffffffffffff710,
               (unsigned_long)in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff708);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
               in_stack_fffffffffffff740,in_stack_fffffffffffff738,
               (const_string *)in_stack_fffffffffffff730);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff710,(char (*) [1])in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff718,(pointer)in_stack_fffffffffffff710,
               (unsigned_long)in_stack_fffffffffffff708);
    local_2a4._vptr_lazy_ostream._0_4_ = 2;
    in_stack_fffffffffffff718 = (basic_cstring<const_char> *)0x1bc65e2;
    in_stack_fffffffffffff710 = &local_2a4;
    in_stack_fffffffffffff708 = "result[4]";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_290,(undefined1 *)((long)&local_2a4._vptr_lazy_ostream + 4),0x1be,1,2,local_18)
    ;
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff708);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_48[0] = 0;
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::clear
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
             in_stack_fffffffffffff708);
  local_2a8 = 1;
  local_2ac = 9;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
             CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728),in_stack_fffffffffffff720
             ,(int *)in_stack_fffffffffffff718);
  local_2b0 = 2;
  local_2b4 = 0x10;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
             CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728),in_stack_fffffffffffff720
             ,(int *)in_stack_fffffffffffff718);
  local_2b8 = 4;
  local_2bc = 0x32;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
             CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728),in_stack_fffffffffffff720
             ,(int *)in_stack_fffffffffffff718);
  local_2c0 = 5;
  local_2c4 = 10;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
             CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728),in_stack_fffffffffffff720
             ,(int *)in_stack_fffffffffffff718);
  local_2c8 = 9;
  local_2cc = 0xf;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
             CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728),in_stack_fffffffffffff720
             ,(int *)in_stack_fffffffffffff718);
  CalculatePercentilesByWeight
            (in_stack_fffffffffffff758,in_stack_fffffffffffff750,
             CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff718,(pointer)in_stack_fffffffffffff710,
               (unsigned_long)in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff708);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
               in_stack_fffffffffffff740,in_stack_fffffffffffff738,
               (const_string *)in_stack_fffffffffffff730);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff710,(char (*) [1])in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff718,(pointer)in_stack_fffffffffffff710,
               (unsigned_long)in_stack_fffffffffffff708);
    local_324._vptr_lazy_ostream._0_4_ = 2;
    in_stack_fffffffffffff718 = (basic_cstring<const_char> *)0x1bc65e2;
    in_stack_fffffffffffff710 = &local_324;
    in_stack_fffffffffffff708 = "result2[0]";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_310,(undefined1 *)((long)&local_324._vptr_lazy_ostream + 4),0x1cd,1,2,&local_68
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff708);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff718,(pointer)in_stack_fffffffffffff710,
               (unsigned_long)in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff708);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
               in_stack_fffffffffffff740,in_stack_fffffffffffff738,
               (const_string *)in_stack_fffffffffffff730);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff710,(char (*) [1])in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff718,(pointer)in_stack_fffffffffffff710,
               (unsigned_long)in_stack_fffffffffffff708);
    local_37c._vptr_lazy_ostream._0_4_ = 2;
    in_stack_fffffffffffff718 = (basic_cstring<const_char> *)0x1bc65e2;
    in_stack_fffffffffffff710 = &local_37c;
    in_stack_fffffffffffff708 = "result2[1]";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_368,(undefined1 *)((long)&local_37c._vptr_lazy_ostream + 4),0x1ce,1,2,
               &uStack_60);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff708);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff718,(pointer)in_stack_fffffffffffff710,
               (unsigned_long)in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff708);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
               in_stack_fffffffffffff740,in_stack_fffffffffffff738,
               (const_string *)in_stack_fffffffffffff730);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff710,(char (*) [1])in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff718,(pointer)in_stack_fffffffffffff710,
               (unsigned_long)in_stack_fffffffffffff708);
    local_3d4._vptr_lazy_ostream._0_4_ = 4;
    in_stack_fffffffffffff718 = (basic_cstring<const_char> *)0x1c17ce0;
    in_stack_fffffffffffff710 = &local_3d4;
    in_stack_fffffffffffff708 = "result2[2]";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_3c0,(undefined1 *)((long)&local_3d4._vptr_lazy_ostream + 4),0x1cf,1,2,&local_58
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff708);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff718,(pointer)in_stack_fffffffffffff710,
               (unsigned_long)in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff708);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
               in_stack_fffffffffffff740,in_stack_fffffffffffff738,
               (const_string *)in_stack_fffffffffffff730);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff710,(char (*) [1])in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff718,(pointer)in_stack_fffffffffffff710,
               (unsigned_long)in_stack_fffffffffffff708);
    local_42c._vptr_lazy_ostream._0_4_ = 4;
    in_stack_fffffffffffff718 = (basic_cstring<const_char> *)0x1c17ce0;
    in_stack_fffffffffffff710 = &local_42c;
    in_stack_fffffffffffff708 = "result2[3]";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_418,(undefined1 *)((long)&local_42c._vptr_lazy_ostream + 4),0x1d0,1,2,
               &uStack_50);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff708);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff718,(pointer)in_stack_fffffffffffff710,
               (unsigned_long)in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff708);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
               in_stack_fffffffffffff740,in_stack_fffffffffffff738,
               (const_string *)in_stack_fffffffffffff730);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff710,(char (*) [1])in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff718,(pointer)in_stack_fffffffffffff710,
               (unsigned_long)in_stack_fffffffffffff708);
    local_484._vptr_lazy_ostream._0_4_ = 9;
    in_stack_fffffffffffff718 = (basic_cstring<const_char> *)0x1bcbf43;
    in_stack_fffffffffffff710 = &local_484;
    in_stack_fffffffffffff708 = "result2[4]";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_470,(undefined1 *)((long)&local_484._vptr_lazy_ostream + 4),0x1d1,1,2,local_48)
    ;
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff708);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_78[0] = 0;
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::clear
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
             in_stack_fffffffffffff708);
  local_488 = 1;
  local_48c = 9;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
             CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728),in_stack_fffffffffffff720
             ,(int *)in_stack_fffffffffffff718);
  local_490 = 2;
  local_494 = 0xb;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
             CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728),in_stack_fffffffffffff720
             ,(int *)in_stack_fffffffffffff718);
  local_498 = 2;
  local_49c = 5;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
             CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728),in_stack_fffffffffffff720
             ,(int *)in_stack_fffffffffffff718);
  local_4a0 = 4;
  local_4a4 = 0x32;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
             CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728),in_stack_fffffffffffff720
             ,(int *)in_stack_fffffffffffff718);
  local_4a8 = 5;
  local_4ac = 10;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
             CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728),in_stack_fffffffffffff720
             ,(int *)in_stack_fffffffffffff718);
  local_4b0 = 9;
  local_4b4 = 0xf;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
             CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728),in_stack_fffffffffffff720
             ,(int *)in_stack_fffffffffffff718);
  CalculatePercentilesByWeight
            (in_stack_fffffffffffff758,in_stack_fffffffffffff750,
             CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff718,(pointer)in_stack_fffffffffffff710,
               (unsigned_long)in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff708);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
               in_stack_fffffffffffff740,in_stack_fffffffffffff738,
               (const_string *)in_stack_fffffffffffff730);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff710,(char (*) [1])in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff718,(pointer)in_stack_fffffffffffff710,
               (unsigned_long)in_stack_fffffffffffff708);
    local_50c._vptr_lazy_ostream._0_4_ = 2;
    in_stack_fffffffffffff718 = (basic_cstring<const_char> *)0x1bc65e2;
    in_stack_fffffffffffff710 = &local_50c;
    in_stack_fffffffffffff708 = "result3[0]";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_4f8,(undefined1 *)((long)&local_50c._vptr_lazy_ostream + 4),0x1e1,1,2,&local_98
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff708);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff718,(pointer)in_stack_fffffffffffff710,
               (unsigned_long)in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff708);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
               in_stack_fffffffffffff740,in_stack_fffffffffffff738,
               (const_string *)in_stack_fffffffffffff730);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff710,(char (*) [1])in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff718,(pointer)in_stack_fffffffffffff710,
               (unsigned_long)in_stack_fffffffffffff708);
    local_564._vptr_lazy_ostream._0_4_ = 2;
    in_stack_fffffffffffff718 = (basic_cstring<const_char> *)0x1bc65e2;
    in_stack_fffffffffffff710 = &local_564;
    in_stack_fffffffffffff708 = "result3[1]";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_550,(undefined1 *)((long)&local_564._vptr_lazy_ostream + 4),0x1e2,1,2,
               &uStack_90);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff708);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff718,(pointer)in_stack_fffffffffffff710,
               (unsigned_long)in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff708);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
               in_stack_fffffffffffff740,in_stack_fffffffffffff738,
               (const_string *)in_stack_fffffffffffff730);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff710,(char (*) [1])in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff718,(pointer)in_stack_fffffffffffff710,
               (unsigned_long)in_stack_fffffffffffff708);
    local_5bc._vptr_lazy_ostream._0_4_ = 4;
    in_stack_fffffffffffff718 = (basic_cstring<const_char> *)0x1c17ce0;
    in_stack_fffffffffffff710 = &local_5bc;
    in_stack_fffffffffffff708 = "result3[2]";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_5a8,(undefined1 *)((long)&local_5bc._vptr_lazy_ostream + 4),0x1e3,1,2,&local_88
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff708);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff718,(pointer)in_stack_fffffffffffff710,
               (unsigned_long)in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff708);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
               in_stack_fffffffffffff740,in_stack_fffffffffffff738,
               (const_string *)in_stack_fffffffffffff730);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff710,(char (*) [1])in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff718,(pointer)in_stack_fffffffffffff710,
               (unsigned_long)in_stack_fffffffffffff708);
    local_614._vptr_lazy_ostream._0_4_ = 4;
    in_stack_fffffffffffff718 = (basic_cstring<const_char> *)0x1c17ce0;
    in_stack_fffffffffffff710 = &local_614;
    in_stack_fffffffffffff708 = "result3[3]";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_600,(undefined1 *)((long)&local_614._vptr_lazy_ostream + 4),0x1e4,1,2,
               &uStack_80);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff708);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    pCVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff718,(pointer)in_stack_fffffffffffff710,
               (unsigned_long)in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff708);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
               in_stack_fffffffffffff740,in_stack_fffffffffffff738,
               (const_string *)in_stack_fffffffffffff730);
    scores = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff710,(char (*) [1])in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff718,(pointer)in_stack_fffffffffffff710,
               (unsigned_long)in_stack_fffffffffffff708);
    local_66c._vptr_lazy_ostream._0_4_ = 9;
    in_stack_fffffffffffff718 = (basic_cstring<const_char> *)0x1bcbf43;
    in_stack_fffffffffffff710 = &local_66c;
    in_stack_fffffffffffff708 = "result3[4]";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_658,(undefined1 *)((long)&local_66c._vptr_lazy_ostream + 4),0x1e5,1,2,local_78)
    ;
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff708);
    in_stack_fffffffffffff74f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff74f);
  local_c8[2] = 0;
  local_c8[3] = 0;
  local_c8[0] = 0;
  local_c8[1] = 0;
  local_c8[4] = 0;
  file = &local_e0;
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::clear
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
             in_stack_fffffffffffff708);
  local_670 = 1;
  local_674 = 100;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
             CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728),in_stack_fffffffffffff720
             ,(int *)in_stack_fffffffffffff718);
  local_678 = 2;
  local_67c = 1;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
             CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728),in_stack_fffffffffffff720
             ,(int *)in_stack_fffffffffffff718);
  local_680 = 3;
  local_684 = 1;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
             CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728),in_stack_fffffffffffff720
             ,(int *)in_stack_fffffffffffff718);
  local_688 = 3;
  local_68c = 1;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
             CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728),in_stack_fffffffffffff720
             ,(int *)in_stack_fffffffffffff718);
  local_690 = 999999;
  local_694 = 1;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
             CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728),in_stack_fffffffffffff720
             ,(int *)in_stack_fffffffffffff718);
  CalculatePercentilesByWeight
            (pCVar2,(vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)scores
             ,CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748));
  for (local_738 = 0; local_738 < 5; local_738 = local_738 + 1) {
    do {
      pCVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (in_stack_fffffffffffff718,(pointer)in_stack_fffffffffffff710,
                 (unsigned_long)in_stack_fffffffffffff708);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff708);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
                 file,(size_t)pCVar2,(const_string *)in_stack_fffffffffffff730);
      in_stack_fffffffffffff730 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_fffffffffffff710,(char (*) [1])in_stack_fffffffffffff708);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (in_stack_fffffffffffff718,(pointer)in_stack_fffffffffffff710,
                 (unsigned_long)in_stack_fffffffffffff708);
      local_6ec._vptr_lazy_ostream._0_4_ = 1;
      in_stack_fffffffffffff718 = (basic_cstring<const_char> *)0x1ccb7e1;
      in_stack_fffffffffffff710 = &local_6ec;
      in_stack_fffffffffffff708 = "result4[i]";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
                (local_6d8,(undefined1 *)((long)&local_6ec._vptr_lazy_ostream + 4),0x1f5,1,2,
                 local_c8 + local_738);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff708);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~vector
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
             in_stack_fffffffffffff718);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(rpc_getblockstats_calculate_percentiles_by_weight)
{
    int64_t total_weight = 200;
    std::vector<std::pair<CAmount, int64_t>> feerates;
    CAmount result[NUM_GETBLOCKSTATS_PERCENTILES] = { 0 };

    for (int64_t i = 0; i < 100; i++) {
        feerates.emplace_back(1 ,1);
    }

    for (int64_t i = 0; i < 100; i++) {
        feerates.emplace_back(2 ,1);
    }

    CalculatePercentilesByWeight(result, feerates, total_weight);
    BOOST_CHECK_EQUAL(result[0], 1);
    BOOST_CHECK_EQUAL(result[1], 1);
    BOOST_CHECK_EQUAL(result[2], 1);
    BOOST_CHECK_EQUAL(result[3], 2);
    BOOST_CHECK_EQUAL(result[4], 2);

    // Test with more pairs, and two pairs overlapping 2 percentiles.
    total_weight = 100;
    CAmount result2[NUM_GETBLOCKSTATS_PERCENTILES] = { 0 };
    feerates.clear();

    feerates.emplace_back(1, 9);
    feerates.emplace_back(2 , 16); //10th + 25th percentile
    feerates.emplace_back(4 ,50); //50th + 75th percentile
    feerates.emplace_back(5 ,10);
    feerates.emplace_back(9 ,15);  // 90th percentile

    CalculatePercentilesByWeight(result2, feerates, total_weight);

    BOOST_CHECK_EQUAL(result2[0], 2);
    BOOST_CHECK_EQUAL(result2[1], 2);
    BOOST_CHECK_EQUAL(result2[2], 4);
    BOOST_CHECK_EQUAL(result2[3], 4);
    BOOST_CHECK_EQUAL(result2[4], 9);

    // Same test as above, but one of the percentile-overlapping pairs is split in 2.
    total_weight = 100;
    CAmount result3[NUM_GETBLOCKSTATS_PERCENTILES] = { 0 };
    feerates.clear();

    feerates.emplace_back(1, 9);
    feerates.emplace_back(2 , 11); // 10th percentile
    feerates.emplace_back(2 , 5); // 25th percentile
    feerates.emplace_back(4 ,50); //50th + 75th percentile
    feerates.emplace_back(5 ,10);
    feerates.emplace_back(9 ,15); // 90th percentile

    CalculatePercentilesByWeight(result3, feerates, total_weight);

    BOOST_CHECK_EQUAL(result3[0], 2);
    BOOST_CHECK_EQUAL(result3[1], 2);
    BOOST_CHECK_EQUAL(result3[2], 4);
    BOOST_CHECK_EQUAL(result3[3], 4);
    BOOST_CHECK_EQUAL(result3[4], 9);

    // Test with one transaction spanning all percentiles.
    total_weight = 104;
    CAmount result4[NUM_GETBLOCKSTATS_PERCENTILES] = { 0 };
    feerates.clear();

    feerates.emplace_back(1, 100);
    feerates.emplace_back(2, 1);
    feerates.emplace_back(3, 1);
    feerates.emplace_back(3, 1);
    feerates.emplace_back(999999, 1);

    CalculatePercentilesByWeight(result4, feerates, total_weight);

    for (int64_t i = 0; i < NUM_GETBLOCKSTATS_PERCENTILES; i++) {
        BOOST_CHECK_EQUAL(result4[i], 1);
    }
}